

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

torrent_handle __thiscall
libtorrent::session_handle::add_torrent(session_handle *this,add_torrent_params *params)

{
  info_hash_t *this_00;
  undefined8 uVar1;
  bool bVar2;
  long in_RDX;
  long lVar3;
  torrent_handle tVar4;
  error_code ec;
  reference_wrapper<boost::system::error_code> ecr;
  undefined1 local_40 [4];
  bool local_3c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  pointer local_30;
  
  this_00 = (info_hash_t *)(in_RDX + 0x124);
  bVar2 = info_hash_t::has_v1(this_00);
  if (bVar2) {
    lVar3 = *(long *)(in_RDX + 8);
  }
  else {
    bVar2 = info_hash_t::has_v2(this_00);
    lVar3 = *(long *)(in_RDX + 8);
    if (lVar3 == 0 && !bVar2) {
      *(undefined4 *)(in_RDX + 0x134) = *(undefined4 *)(in_RDX + 0x120);
      uVar1 = *(undefined8 *)(in_RDX + 0x118);
      *(undefined8 *)(this_00->v1).m_number._M_elems = *(undefined8 *)(in_RDX + 0x110);
      *(undefined8 *)(in_RDX + 300) = uVar1;
      goto LAB_00277b01;
    }
  }
  if (lVar3 != 0) {
    ::std::make_shared<libtorrent::torrent_info,libtorrent::torrent_info&>((torrent_info *)local_40)
    ;
    ::std::__shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> *)(in_RDX + 8),
               (__shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> *)local_40);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  }
LAB_00277b01:
  local_30 = (pointer)local_40;
  local_40 = (undefined1  [4])0x0;
  local_3c = false;
  local_38._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       &boost::system::detail::cat_holder<void>::system_category_instance;
  tVar4 = sync_call_ret<libtorrent::torrent_handle,libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::add_torrent_params&&,boost::system::error_code&),libtorrent::add_torrent_params,std::reference_wrapper<boost::system::error_code>&>
                    (this,(offset_in_session_impl_to_subr)params,
                     (add_torrent_params *)aux::session_impl::add_torrent,
                     (reference_wrapper<boost::system::error_code> *)0x0);
  if (local_3c != true) {
    tVar4.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (torrent_handle)
           tVar4.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
  }
  aux::throw_ex<boost::system::system_error,boost::system::error_code&>((error_code *)local_40);
}

Assistant:

torrent_handle session_handle::add_torrent(add_torrent_params&& params)
	{
		TORRENT_ASSERT_PRECOND(!params.save_path.empty());

#if TORRENT_ABI_VERSION < 3
		if (!params.info_hashes.has_v1() && !params.info_hashes.has_v2() && !params.ti)
			params.info_hashes.v1 = params.info_hash;
#endif

		// the internal torrent object keeps and mutates state in the
		// torrent_info object. We can't let that leak back to the client
		if (params.ti)
			params.ti = std::make_shared<torrent_info>(*params.ti);

#if TORRENT_ABI_VERSION == 1
		handle_backwards_compatible_resume_data(params);
#endif
		error_code ec;
		auto ecr = std::ref(ec);
		auto r = sync_call_ret<torrent_handle>(&session_impl::add_torrent, std::move(params), ecr);
		if (ec) aux::throw_ex<system_error>(ec);
		return r;
	}